

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

void anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::save
               (Model *model,Type *data,Json *target)

{
  reference this;
  undefined1 local_60 [16];
  string local_50;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_30;
  Json *local_20;
  Json *target_local;
  Type *data_local;
  Model *model_local;
  
  local_20 = target;
  target_local = (Json *)data;
  data_local = (Type *)model;
  surface_geometry((Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *)local_60);
  Ref<anurbs::NurbsSurfaceGeometry<3l>>::key_abi_cxx11_
            ((string *)(local_60 + 0x10),
             (Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *)local_60);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_60 + 0x10))
  ;
  this = nlohmann::
         basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>
                   ((basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     *)local_20,"geometry");
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(this,&local_30);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_30);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)local_60);
  return;
}

Assistant:

static void save(const Model& model, const Type& data, Json& target)
    {
        target["geometry"] = data.surface_geometry().key();
    }